

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators-inl.h
# Opt level: O2

void __thiscall
spdlog::populators::logger_name_populator::populate
          (logger_name_populator *this,log_msg *msg,json *dest)

{
  value_t vVar1;
  formatter *pfVar2;
  json_value jVar3;
  reference pvVar4;
  memory_buf_t tmp;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_130;
  
  local_130.super_buffer<char>.ptr_ = local_130.store_;
  local_130.super_buffer<char>.size_ = 0;
  local_130.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c480;
  local_130.super_buffer<char>.capacity_ = 0xfa;
  pfVar2 = (this->super_pattern_populator).pf_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (*pfVar2->_vptr_formatter[2])(pfVar2,msg,&local_130);
  if (local_130.super_buffer<char>.size_ != 0) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,local_130.super_buffer<char>.ptr_,
               local_130.super_buffer<char>.ptr_ + local_130.super_buffer<char>.size_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_160,&local_150);
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](dest,&(this->super_pattern_populator).kKey);
    vVar1 = pvVar4->m_type;
    pvVar4->m_type = local_160.m_type;
    jVar3 = pvVar4->m_value;
    pvVar4->m_value = local_160.m_value;
    local_160.m_type = vVar1;
    local_160.m_value = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
  }
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::deallocate(&local_130);
  return;
}

Assistant:

SPDLOG_INLINE void logger_name_populator::populate(const details::log_msg &msg, nlohmann::json &dest)
{
    memory_buf_t tmp;
    pf_->format(msg, tmp);
    if (tmp.size() > 0) {
        dest[kKey] = std::string(tmp.data(), tmp.size());
    }
}